

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::cose::Sign1Message::Validate
          (Error *__return_storage_ptr__,Sign1Message *this,CborMap *aCborPublicKey)

{
  char cVar1;
  cn_cbor *pKey;
  _Bool _Var2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  writer write;
  writer local_b8;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pKey = (aCborPublicKey->super_CborValue).mCbor;
  if (pKey == (cn_cbor *)0x0) {
    local_68.types_[0] = none_type;
    pcVar3 = "validate COSE SIGN1 message with invalid public key";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "validate COSE SIGN1 message with invalid public key";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_b8.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_b8,pcVar3,"");
          goto LAB_001d5582;
        }
        cVar1 = *pcVar4;
      }
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_b8,pcVar3,pcVar4);
      pcVar3 = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",&local_68);
    } while (pcVar3 != "");
LAB_001d5582:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"validate COSE SIGN1 message with invalid public key",
               (string_view)ZEXT816(0x33),args);
    local_90 = kInvalidArgs;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
  }
  else {
    _Var2 = COSE_Sign0_validate(this->mSign,pKey,(cose_errback *)0x0);
    if (_Var2) {
      return __return_storage_ptr__;
    }
    local_68.types_[0] = none_type;
    pcVar3 = "validate COSE SIGN1 message failed";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "validate COSE SIGN1 message failed";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x22;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_b8.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_b8,pcVar3,"");
          goto LAB_001d55e1;
        }
        cVar1 = *pcVar4;
      }
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_b8,pcVar3,pcVar4);
      pcVar3 = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",&local_68);
    } while (pcVar3 != "");
LAB_001d55e1:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"validate COSE SIGN1 message failed",(string_view)ZEXT816(0x22),
               args_00);
    local_90 = kSecurity;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
  }
  __return_storage_ptr__->mCode = local_90;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Validate(const CborMap &aCborPublicKey)
{
    Error error;

    VerifyOrExit(aCborPublicKey.IsValid(),
                 error = ERROR_INVALID_ARGS("validate COSE SIGN1 message with invalid public key"));

    VerifyOrExit(COSE_Sign0_validate(mSign, aCborPublicKey.GetImpl(), nullptr),
                 error = ERROR_SECURITY("validate COSE SIGN1 message failed"));

exit:
    return error;
}